

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatusFunction.hpp
# Opt level: O2

void __thiscall
OpenMD::DumpStatusFunction::DumpStatusFunction(DumpStatusFunction *this,SimInfo *info)

{
  Stats *this_00;
  DumpWriter *this_01;
  StatWriter *this_02;
  StatsBitSet mask;
  string local_38;
  
  (this->super_StatusFunction)._vptr_StatusFunction =
       (_func_int **)&PTR__DumpStatusFunction_002c5e38;
  this->info_ = info;
  this_00 = (Stats *)operator_new(0x68);
  Stats::Stats(this_00,info);
  this->stats = this_00;
  this_01 = (DumpWriter *)operator_new(0x60);
  DumpWriter::DumpWriter(this_01,this->info_);
  this->dumpWriter = this_01;
  mask.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  std::bitset<46UL>::set(&mask,0,true);
  std::bitset<46UL>::set(&mask,2,true);
  Stats::setStatsMask(this->stats,mask);
  this_02 = (StatWriter *)operator_new(0x448);
  std::__cxx11::string::string((string *)&local_38,(string *)&this->info_->statFileName_);
  StatWriter::StatWriter(this_02,&local_38,this->stats);
  this->statWriter = this_02;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

DumpStatusFunction(SimInfo* info) : StatusFunction(), info_(info) {
      stats      = new Stats(info_);
      dumpWriter = new DumpWriter(info_);
      Stats::StatsBitSet mask;
      mask.set(Stats::TIME);
      mask.set(Stats::POTENTIAL_ENERGY);
      stats->setStatsMask(mask);
      statWriter = new StatWriter(info_->getStatFileName(), stats);
    }